

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_elements_confidentialtxin.cpp
# Opt level: O3

void __thiscall
ConfidentialTxIn_ConstractorEmpty_Test::TestBody(ConfidentialTxIn_ConstractorEmpty_Test *this)

{
  bool bVar1;
  char *pcVar2;
  AssertionResult gtest_ar;
  ConfidentialTxIn txin1;
  Message local_188;
  AssertHelper local_180;
  internal local_178 [8];
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_170;
  ConfidentialTxIn local_168;
  
  cfd::core::ConfidentialTxIn::ConfidentialTxIn(&local_168);
  local_188.ss_.ptr_._0_4_ = cfd::core::AbstractTxIn::GetVout(&local_168.super_AbstractTxIn);
  local_180.data_._0_4_ = 0;
  testing::internal::CmpHelperEQ<unsigned_int,int>
            (local_178,"txin1.GetVout()","0",(uint *)&local_188,(int *)&local_180);
  if (local_178[0] == (internal)0x0) {
    testing::Message::Message(&local_188);
    if (local_170.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((local_170.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_180,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_elements_confidentialtxin.cpp"
               ,0x41,pcVar2);
    testing::internal::AssertHelper::operator=(&local_180,&local_188);
    testing::internal::AssertHelper::~AssertHelper(&local_180);
    if (CONCAT44(local_188.ss_.ptr_._4_4_,(uint32_t)local_188.ss_.ptr_) != 0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         ((long *)CONCAT44(local_188.ss_.ptr_._4_4_,(uint32_t)local_188.ss_.ptr_) != (long *)0x0)) {
        (**(code **)(*(long *)CONCAT44(local_188.ss_.ptr_._4_4_,(uint32_t)local_188.ss_.ptr_) + 8))
                  ();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_170,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_188.ss_.ptr_._0_4_ = cfd::core::AbstractTxIn::GetSequence(&local_168.super_AbstractTxIn);
  local_180.data_._0_4_ = 0;
  testing::internal::CmpHelperEQ<unsigned_int,int>
            (local_178,"txin1.GetSequence()","0",(uint *)&local_188,(int *)&local_180);
  if (local_178[0] == (internal)0x0) {
    testing::Message::Message(&local_188);
    if (local_170.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((local_170.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_180,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_elements_confidentialtxin.cpp"
               ,0x42,pcVar2);
    testing::internal::AssertHelper::operator=(&local_180,&local_188);
    testing::internal::AssertHelper::~AssertHelper(&local_180);
    if (CONCAT44(local_188.ss_.ptr_._4_4_,(uint32_t)local_188.ss_.ptr_) != 0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         ((long *)CONCAT44(local_188.ss_.ptr_._4_4_,(uint32_t)local_188.ss_.ptr_) != (long *)0x0)) {
        (**(code **)(*(long *)CONCAT44(local_188.ss_.ptr_._4_4_,(uint32_t)local_188.ss_.ptr_) + 8))
                  ();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_170,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  cfd::core::ConfidentialTxIn::~ConfidentialTxIn(&local_168);
  return;
}

Assistant:

TEST(ConfidentialTxIn, ConstractorEmpty) {
  ConfidentialTxIn txin1;
  EXPECT_EQ(txin1.GetVout(), 0);
  EXPECT_EQ(txin1.GetSequence(), 0);
}